

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_cabac.c
# Opt level: O1

IHEVCD_ERROR_T ihevcd_cabac_reset(cab_ctxt_t *ps_cabac,bitstrm_t *ps_bitstrm)

{
  UWORD32 UVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  uint uVar5;
  
  if (ps_cabac == (cab_ctxt_t *)0x0) {
    __assert_fail("(ps_cabac != ((void*)0))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_cabac.c"
                  ,0xad,"IHEVCD_ERROR_T ihevcd_cabac_reset(cab_ctxt_t *, bitstrm_t *)");
  }
  if (ps_bitstrm != (bitstrm_t *)0x0) {
    ps_cabac->u4_range = 0x7f800000;
    UVar1 = ps_bitstrm->u4_bit_ofst;
    uVar4 = (ps_bitstrm->u4_cur_word << ((byte)UVar1 & 0x1f)) >> 1;
    ps_cabac->u4_ofst = uVar4;
    uVar2 = UVar1 + 0x1f;
    ps_bitstrm->u4_bit_ofst = uVar2;
    if (0x20 < uVar2) {
      uVar5 = 0;
      if (0x21 - UVar1 < 0x20) {
        uVar5 = ps_bitstrm->u4_nxt_word >> ((byte)(0x21 - UVar1) & 0x1f);
      }
      ps_cabac->u4_ofst = uVar5 | uVar4;
    }
    if (0x1f < uVar2) {
      ps_bitstrm->u4_cur_word = ps_bitstrm->u4_nxt_word;
      puVar3 = ps_bitstrm->pu4_buf;
      ps_bitstrm->pu4_buf = puVar3 + 1;
      uVar2 = *puVar3;
      ps_bitstrm->u4_bit_ofst = UVar1 - 1;
      ps_bitstrm->u4_nxt_word =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    }
    return 0;
  }
  __assert_fail("(ps_bitstrm != ((void*)0))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_cabac.c"
                ,0xae,"IHEVCD_ERROR_T ihevcd_cabac_reset(cab_ctxt_t *, bitstrm_t *)");
}

Assistant:

IHEVCD_ERROR_T ihevcd_cabac_reset(cab_ctxt_t *ps_cabac,
                                  bitstrm_t *ps_bitstrm)
{
    /* Sanity checks */
    ASSERT(ps_cabac != NULL);
    ASSERT(ps_bitstrm != NULL);

    /* CABAC engine uses 32 bit range instead of 9 bits as specified by
     * the spec. This is done to reduce number of renormalizations
     */
    /* cabac engine initialization */
#if FULLRANGE
    ps_cabac->u4_range = (UWORD32)510 << RANGE_SHIFT;
    BITS_GET(ps_cabac->u4_ofst, ps_bitstrm->pu4_buf, ps_bitstrm->u4_bit_ofst,
                    ps_bitstrm->u4_cur_word, ps_bitstrm->u4_nxt_word, (9 + RANGE_SHIFT));

#else
    ps_cabac->u4_range = (UWORD32)510;
    BITS_GET(ps_cabac->u4_ofst, ps_bitstrm->pu4_buf, ps_bitstrm->u4_bit_ofst,
                    ps_bitstrm->u4_cur_word, ps_bitstrm->u4_nxt_word, 9);

#endif

    return ((IHEVCD_ERROR_T)IHEVCD_SUCCESS);
}